

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_algorithms_tests.hpp
# Opt level: O3

void test_parallel_for_task(void)

{
  size_type *psVar1;
  element_type *peVar2;
  uint64_t uid;
  bool bVar3;
  uint __val;
  undefined4 uVar4;
  int __val_00;
  long lVar5;
  uint uVar6;
  undefined8 *puVar7;
  long *plVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  timing_registry *this;
  uint uVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  __pthread_internal_list *p_Var12;
  __native_type *p_Var13;
  ulong uVar14;
  _Map_pointer pptVar15;
  task_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
  *ptVar16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  __pthread_internal_list *p_Var17;
  undefined8 uVar18;
  element_type *peVar19;
  int iVar20;
  int iVar21;
  uint uVar22;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_1;
  test __t;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  uint __uval;
  string __str_2;
  string __str_1;
  test local_159;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_158;
  undefined1 local_150 [32];
  __native_type *local_130;
  long local_128;
  __native_type local_120;
  __pthread_internal_list local_f8;
  task_handle *local_e8;
  _Elt_pointer local_e0;
  task_handle local_d8;
  task_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
  *local_c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_c0;
  undefined1 local_b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  task_priority local_90 [16];
  __pthread_internal_list local_80;
  task_handle *local_70;
  _Elt_pointer local_68;
  task_handle local_60;
  task_handle local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  _Map_pointer local_38;
  
  test::test(&local_159,"test_parallel_for_task");
  uVar4 = oqpi::
          helpers<oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>>
          ::scheduler_._32_4_;
  __val_00 = gTaskCount;
  __val = oqpi::
          helpers<oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>>
          ::scheduler_._32_4_;
  if (gTaskCount <
      (int)oqpi::
           helpers<oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>>
           ::scheduler_._32_4_) {
    __val = gTaskCount;
  }
  if (gTaskCount <
      (int)oqpi::
           helpers<oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>>
           ::scheduler_._32_4_) {
    iVar20 = 0;
    iVar21 = 1;
  }
  else {
    iVar21 = gTaskCount / (int)__val;
    iVar20 = gTaskCount % (int)__val;
  }
  local_70 = &local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"FibonacciParallelForGroup","");
  if (__val_00 < 1) {
    p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    ptVar16 = (task_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
               *)0x0;
    goto LAB_0016ac13;
  }
  local_130 = &local_120;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_130,local_70,
             (long)&(local_70->spTask_).
                    super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
             (long)&(local_68->spTask_).
                    super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__cxx11::string::append((char *)&local_130);
  uVar22 = 1;
  if (9 < (uint)__val_00) {
    uVar10 = __val_00;
    uVar6 = 4;
    do {
      uVar22 = uVar6;
      if (uVar10 < 100) {
        uVar22 = uVar22 - 2;
        goto LAB_0016a53e;
      }
      if (uVar10 < 1000) {
        uVar22 = uVar22 - 1;
        goto LAB_0016a53e;
      }
      if (uVar10 < 10000) goto LAB_0016a53e;
      bVar3 = 99999 < uVar10;
      uVar10 = uVar10 / 10000;
      uVar6 = uVar22 + 4;
    } while (bVar3);
    uVar22 = uVar22 + 1;
  }
LAB_0016a53e:
  local_120.__data.__list.__prev = &local_f8;
  std::__cxx11::string::_M_construct((long)&local_120 + 0x18,(char)uVar22);
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)local_120.__data.__list.__prev,uVar22,__val_00);
  p_Var12 = (__pthread_internal_list *)(local_128 + (long)&(local_120.__data.__list.__next)->__prev)
  ;
  uVar18 = (__pthread_internal_list *)0xf;
  if (local_130 != &local_120) {
    uVar18 = local_120.__align;
  }
  if ((ulong)uVar18 < p_Var12) {
    p_Var17 = (__pthread_internal_list *)0xf;
    if (local_120.__data.__list.__prev != &local_f8) {
      p_Var17 = local_f8.__prev;
    }
    if (p_Var17 < p_Var12) goto LAB_0016a5b5;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((long)&local_120 + 0x18,0,(char *)0x0,(ulong)local_130);
  }
  else {
LAB_0016a5b5:
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)&local_130,(ulong)local_120.__data.__list.__prev);
  }
  local_150._0_8_ = local_150 + 0x10;
  psVar1 = puVar7 + 2;
  if ((size_type *)*puVar7 == psVar1) {
    local_150._16_8_ = *psVar1;
    local_150._24_8_ = puVar7[3];
  }
  else {
    local_150._16_8_ = *psVar1;
    local_150._0_8_ = (size_type *)*puVar7;
  }
  local_150._8_8_ = puVar7[1];
  *puVar7 = psVar1;
  puVar7[1] = 0;
  *(undefined1 *)psVar1 = 0;
  plVar8 = (long *)std::__cxx11::string::append(local_150);
  local_b0._0_8_ = &local_a0;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 == paVar11) {
    local_a0._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_a0._8_8_ = plVar8[3];
  }
  else {
    local_a0._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_b0._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*plVar8;
  }
  local_b0._8_8_ = plVar8[1];
  *plVar8 = (long)paVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if ((undefined1 *)local_150._0_8_ != local_150 + 0x10) {
    operator_delete((void *)local_150._0_8_,local_150._16_8_ + 1);
  }
  if (local_120.__data.__list.__prev != &local_f8) {
    operator_delete(local_120.__data.__list.__prev,(ulong)((long)&(local_f8.__prev)->__prev + 1));
  }
  if (local_130 != &local_120) {
    operator_delete(local_130,(ulong)(local_120.__align + 1));
  }
  local_90[0] = 2;
  local_150._0_4_ = __val;
  local_130 = (__native_type *)((ulong)local_130 & 0xffffffff00000000);
  std::
  __shared_ptr<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,(oqpi::task_type)1,oqpi::context_container<oqpi::task_group_base,timer_group_context>>,(__gnu_cxx::_Lock_policy)2>
  ::
  __shared_ptr<std::allocator<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,(oqpi::task_type)1,oqpi::context_container<oqpi::task_group_base,timer_group_context>>>,oqpi::scheduler<concurrent_queue>&,std::__cxx11::string_const&,oqpi::task_priority&,int&,int&>
            ((__shared_ptr<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,(oqpi::task_type)1,oqpi::context_container<oqpi::task_group_base,timer_group_context>>,(__gnu_cxx::_Lock_policy)2>
              *)&local_c8,
             (allocator<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>_>
              *)((long)&local_120 + 0x18),
             (scheduler<concurrent_queue> *)
             oqpi::
             helpers<oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>>
             ::scheduler_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,local_90,
             (int *)local_150,(int *)&local_130);
  local_158 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
  local_158->_M_use_count = 1;
  local_158->_M_weak_count = 1;
  local_158->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001f8e10;
  pptVar15 = (_Map_pointer)0x0;
  *(undefined4 *)&local_158[1]._vptr__Sp_counted_base = 0;
  *(int *)((long)&local_158[1]._vptr__Sp_counted_base + 4) = __val_00;
  local_158[1]._M_use_count = __val_00;
  local_158[1]._M_weak_count = __val;
  *(int *)&local_158[2]._vptr__Sp_counted_base = iVar21;
  *(int *)((long)&local_158[2]._vptr__Sp_counted_base + 4) = iVar20;
  local_158[2]._M_use_count = 0;
  if (0 < (int)uVar4) {
    local_40 = local_158 + 1;
    do {
      local_120._20_4_ = (uint)pptVar15 + 1;
      uVar22 = 1;
      if (8 < (uint)pptVar15) {
        uVar10 = local_120._20_4_;
        uVar6 = 4;
        do {
          uVar22 = uVar6;
          if (uVar10 < 100) {
            uVar22 = uVar22 - 2;
            goto LAB_0016a7cd;
          }
          if (uVar10 < 1000) {
            uVar22 = uVar22 - 1;
            goto LAB_0016a7cd;
          }
          if (uVar10 < 10000) goto LAB_0016a7cd;
          bVar3 = 99999 < uVar10;
          uVar10 = uVar10 / 10000;
          uVar6 = uVar22 + 4;
        } while (bVar3);
        uVar22 = uVar22 + 1;
      }
LAB_0016a7cd:
      local_90._0_8_ = &local_80;
      local_38 = pptVar15;
      std::__cxx11::string::_M_construct((ulong)local_90,(char)uVar22);
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)local_90._0_8_,uVar22,local_120._20_4_);
      plVar8 = (long *)std::__cxx11::string::replace((ulong)local_90,0,(char *)0x0,0x1c889b);
      p_Var12 = (__pthread_internal_list *)(plVar8 + 2);
      if ((__pthread_internal_list *)*plVar8 == p_Var12) {
        local_f8.__prev = p_Var12->__prev;
        local_f8.__next = (__pthread_internal_list *)plVar8[3];
        local_120.__data.__list.__prev = &local_f8;
      }
      else {
        local_f8.__prev = p_Var12->__prev;
        local_120.__data.__list.__prev = (__pthread_internal_list *)*plVar8;
      }
      local_120.__data.__list.__next = (__pthread_internal_list *)plVar8[1];
      *plVar8 = (long)p_Var12;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append(local_120.__size + 0x18);
      local_130 = &local_120;
      p_Var13 = (__native_type *)(plVar8 + 2);
      if ((__native_type *)*plVar8 == p_Var13) {
        local_120.__align = *(undefined8 *)&(p_Var13->__data).__lock;
        local_120._8_8_ = plVar8[3];
      }
      else {
        local_120.__align = *(undefined8 *)&(p_Var13->__data).__lock;
        local_130 = (__native_type *)*plVar8;
      }
      local_128 = plVar8[1];
      *plVar8 = (long)p_Var13;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      uVar22 = 1;
      if (9 < __val) {
        uVar14 = (ulong)__val;
        uVar10 = 4;
        do {
          uVar22 = uVar10;
          uVar6 = (uint)uVar14;
          if (uVar6 < 100) {
            uVar22 = uVar22 - 2;
            goto LAB_0016a90b;
          }
          if (uVar6 < 1000) {
            uVar22 = uVar22 - 1;
            goto LAB_0016a90b;
          }
          if (uVar6 < 10000) goto LAB_0016a90b;
          uVar14 = uVar14 / 10000;
          uVar10 = uVar22 + 4;
        } while (99999 < uVar6);
        uVar22 = uVar22 + 1;
      }
LAB_0016a90b:
      local_e8 = &local_d8;
      std::__cxx11::string::_M_construct((ulong)&local_e8,(char)uVar22);
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_e8,uVar22,__val);
      uVar18 = (element_type *)0xf;
      if (local_130 != &local_120) {
        uVar18 = local_120.__align;
      }
      peVar2 = (element_type *)
               ((long)&(local_e0->spTask_).
                       super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
               local_128);
      if ((ulong)uVar18 < peVar2) {
        peVar19 = (element_type *)0xf;
        if (local_e8 != &local_d8) {
          peVar19 = local_d8.spTask_.super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
        }
        if (peVar19 < peVar2) goto LAB_0016a996;
        puVar7 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_e8,0,(char *)0x0,(ulong)local_130);
      }
      else {
LAB_0016a996:
        puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_e8);
      }
      local_150._0_8_ = local_150 + 0x10;
      psVar1 = puVar7 + 2;
      if ((size_type *)*puVar7 == psVar1) {
        local_150._16_8_ = *psVar1;
        local_150._24_8_ = puVar7[3];
      }
      else {
        local_150._16_8_ = *psVar1;
        local_150._0_8_ = (size_type *)*puVar7;
      }
      local_150._8_8_ = puVar7[1];
      *puVar7 = psVar1;
      puVar7[1] = 0;
      *(undefined1 *)psVar1 = 0;
      if (local_e8 != &local_d8) {
        operator_delete(local_e8,(ulong)((long)&(local_d8.spTask_.
                                                 super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_ptr)->_vptr_task_base + 1));
      }
      if (local_130 != &local_120) {
        operator_delete(local_130,(ulong)(local_120.__align + 1));
      }
      if (local_120.__data.__list.__prev != &local_f8) {
        operator_delete(local_120.__data.__list.__prev,(ulong)((long)&(local_f8.__prev)->__prev + 1)
                       );
      }
      if ((__pthread_internal_list *)local_90._0_8_ != &local_80) {
        operator_delete((void *)local_90._0_8_,(ulong)((long)&(local_80.__prev)->__prev + 1));
      }
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_158->_M_use_count = local_158->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_158->_M_use_count = local_158->_M_use_count + 1;
      }
      p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x60);
      p_Var9->_M_use_count = 1;
      p_Var9->_M_weak_count = 1;
      p_Var9->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001f82b8;
      p_Var9[1]._vptr__Sp_counted_base = (_func_int **)&PTR__task_base_001f8180;
      LOCK();
      UNLOCK();
      uVar4 = oqpi::task_base::uid_provider()::uid_generator._4_4_;
      lVar5 = oqpi::task_base::uid_provider()::uid_generator + 1;
      p_Var9[1]._M_use_count = (undefined4)oqpi::task_base::uid_provider()::uid_generator;
      oqpi::task_base::uid_provider()::uid_generator = lVar5;
      p_Var9[1]._M_weak_count = uVar4;
      p_Var9[2]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var9[2]._M_use_count = 0;
      p_Var9[2]._M_weak_count = 0;
      *(undefined2 *)&p_Var9[3]._vptr__Sp_counted_base = 2;
      *(undefined1 *)((long)&p_Var9[3]._vptr__Sp_counted_base + 2) = 0;
      p_Var9[1]._vptr__Sp_counted_base = (_func_int **)&PTR__task_001f8308;
      *(element_type **)&p_Var9[3]._M_use_count = (element_type *)(p_Var9 + 1);
      this = timing_registry::get();
      uid._0_4_ = p_Var9[1]._M_use_count;
      uid._4_4_ = p_Var9[1]._M_weak_count;
      timing_registry::registerTask(this,uid,(string *)local_150);
      p_Var9[1]._vptr__Sp_counted_base = (_func_int **)&PTR__task_001f8308;
      *(int *)&p_Var9[4]._vptr__Sp_counted_base = (int)local_38;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&p_Var9[4]._M_use_count = local_40;
      p_Var9[5]._vptr__Sp_counted_base = (_func_int **)local_158;
      local_50.spTask_.super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)(p_Var9 + 1);
      local_50.spTask_.super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = p_Var9;
      oqpi::
      task_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
      ::addTask(local_c8,&local_50);
      if (local_50.spTask_.super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_50.spTask_.super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((undefined1 *)local_150._0_8_ != local_150 + 0x10) {
        operator_delete((void *)local_150._0_8_,local_150._16_8_ + 1);
      }
      pptVar15 = (_Map_pointer)(ulong)(uint)local_120._20_4_;
    } while (local_120._20_4_ != __val);
  }
  p_Var9 = p_Stack_c0;
  ptVar16 = local_c8;
  local_c8 = (task_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
              *)0x0;
  p_Stack_c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_158);
  if (p_Stack_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_c0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._0_8_ != &local_a0) {
    operator_delete((void *)local_b0._0_8_,local_a0._M_allocated_capacity + 1);
  }
LAB_0016ac13:
  if (local_70 != &local_60) {
    operator_delete(local_70,(ulong)((long)&(local_60.spTask_.
                                             super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr)->_vptr_task_base + 1));
  }
  if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
    }
  }
  local_b0._0_8_ = ptVar16;
  local_b0._8_8_ = p_Var9;
  oqpi::scheduler<concurrent_queue>::add
            ((scheduler<concurrent_queue> *)local_150,
             (task_handle *)
             oqpi::
             helpers<oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>>
             ::scheduler_);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_);
  }
  oqpi::task_handle::validate((task_handle *)local_150);
  (**(code **)(*(long *)local_150._0_8_ + 0x20))();
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._8_8_);
  }
  if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
  }
  test::~test(&local_159);
  return;
}

Assistant:

void test_parallel_for_task()
{
    TEST_FUNC;

    const auto prio = oqpi::task_priority::normal;
    const auto partitioner = oqpi::simple_partitioner(gTaskCount, oqpi_tk::scheduler().workersCount(prio));
    auto spParallelForGroup = oqpi_tk::make_parallel_for_task_group<oqpi::task_type::waitable>("FibonacciParallelForGroup", partitioner, prio,
        [](int32_t i)
    {
        volatile auto a = 0ull;
        a += fibonacci(gValue + a);
        a += i;
    });
    oqpi_tk::schedule_task(oqpi::task_handle(spParallelForGroup)).wait();
}